

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_refPrefix_advanced
                 (ZSTD_CCtx *cctx,void *prefix,size_t prefixSize,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_dictContentType_e dictContentType_local;
  size_t prefixSize_local;
  void *prefix_local;
  ZSTD_CCtx *cctx_local;
  size_t local_8;
  
  if (cctx->streamStage == zcss_init) {
    cctx->cdict = (ZSTD_CDict *)0x0;
    (cctx->prefixDict).dict = prefix;
    (cctx->prefixDict).dictSize = prefixSize;
    (cctx->prefixDict).dictContentType = dictContentType;
    local_8 = 0;
  }
  else {
    local_8 = 0xffffffffffffffc4;
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtx_refPrefix_advanced(
        ZSTD_CCtx* cctx, const void* prefix, size_t prefixSize, ZSTD_dictContentType_e dictContentType)
{
    if (cctx->streamStage != zcss_init) return ERROR(stage_wrong);
    cctx->cdict = NULL;   /* prefix discards any prior cdict */
    cctx->prefixDict.dict = prefix;
    cctx->prefixDict.dictSize = prefixSize;
    cctx->prefixDict.dictContentType = dictContentType;
    return 0;
}